

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O1

t_int * upsampling_perform_linear(t_int *w)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  t_int tVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  tVar4 = w[4];
  iVar5 = (int)w[5] * (int)tVar4;
  pfVar1 = *(float **)(w[1] + 0x30);
  fVar9 = *pfVar1;
  if (0 < iVar5) {
    pfVar2 = (float *)w[2];
    fVar10 = *pfVar2;
    lVar3 = w[3];
    lVar6 = 0;
    do {
      fVar11 = (float)((int)lVar6 + 1) / (float)(int)tVar4;
      iVar7 = (int)fVar11;
      uVar8 = -(uint)(fVar11 - (float)(int)fVar11 == 0.0);
      fVar11 = (float)(uVar8 & 0x3f800000 | ~uVar8 & (uint)(fVar11 - (float)(int)fVar11));
      *(float *)(lVar3 + lVar6 * 4) = fVar9 * (1.0 - fVar11) + fVar10 * fVar11;
      if (iVar7 != 0) {
        fVar9 = pfVar2[(long)iVar7 + -1];
      }
      fVar10 = pfVar2[iVar7];
      lVar6 = lVar6 + 1;
    } while (iVar5 != (int)lVar6);
  }
  *pfVar1 = fVar9;
  return w + 6;
}

Assistant:

t_int *upsampling_perform_linear(t_int *w)
{
  t_resample *x= (t_resample *)(w[1]);
  t_sample *in  = (t_sample *)(w[2]); /* original signal     */
  t_sample *out = (t_sample *)(w[3]); /* upsampled signal    */
  int up       = (int)(w[4]);       /* upsampling factor   */
  int parent   = (int)(w[5]);       /* original vectorsize */
  int length   = parent*up;
  int n;
  t_sample *fp;
  t_sample a=*x->buffer, b=*in;


  for (n=0; n<length; n++) {
    t_sample findex = (t_sample)(n+1)/up;
    int     index  = findex;
    t_sample frac=findex - index;
    if (frac==0.)frac=1.;
    *out++ = frac * b + (1.-frac) * a;
    fp = in+index;
    b=*fp;
    a=(index)?*(fp-1):a;
  }

  *x->buffer = a;
  return (w+6);
}